

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkFromGlobalBdds(Abc_Ntk_t *pNtk,int fReverse)

{
  int iVar1;
  DdManager *ddDestination;
  Vec_Ptr_t *pVVar2;
  long *plVar3;
  int *piVar4;
  DdManager *ddSource;
  Abc_Obj_t *pObj;
  int iVar5;
  void *pvVar6;
  undefined8 uVar7;
  DdNode *pDVar8;
  Vec_Ptr_t *pVVar9;
  DdNode *n;
  DdNode *n_00;
  DdNode *pDVar10;
  Abc_Ntk_t *pAVar11;
  ProgressBar *p;
  char *__s1;
  char *__s2;
  Abc_Ntk_t *pAVar12;
  Abc_Obj_t *pAVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  
  if (7 < pNtk->vAttrs->nSize) {
    ddDestination = *(DdManager **)((long)pNtk->vAttrs->pArray[7] + 0x10);
    pAVar11 = pNtk->pExdc;
    if (pAVar11 == (Abc_Ntk_t *)0x0) {
LAB_002a1424:
      pAVar11 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_BDD);
      Cudd_bddIthVar((DdManager *)pAVar11->pManFunc,ddDestination->size + -1);
      p = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
      pVVar9 = pNtk->vCos;
      if (0 < pVVar9->nSize) {
        lVar16 = 0;
        do {
          pObj = (Abc_Obj_t *)pVVar9->pArray[lVar16];
          if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= lVar16)) {
            Extra_ProgressBarUpdate_int(p,(int)lVar16,(char *)0x0);
          }
          pAVar12 = pObj->pNtk;
          pAVar13 = (Abc_Obj_t *)pAVar12->vObjs->pArray[*(pObj->vFanins).pArray];
          uVar14 = *(uint *)&pAVar13->field_0x14 & 0xf;
          if ((uVar14 == 5) || (uVar14 == 2)) {
            __s1 = Abc_ObjName(pObj);
            __s2 = Abc_ObjName(pAVar13);
            iVar5 = strcmp(__s1,__s2);
            if (iVar5 != 0) {
              pAVar12 = pObj->pNtk;
              goto LAB_002a14f1;
            }
            Abc_ObjAddFanin((pObj->field_6).pCopy,(pAVar13->field_6).pCopy);
          }
          else {
LAB_002a14f1:
            if (pAVar12->vAttrs->nSize < 8) goto LAB_002a160c;
            piVar4 = (int *)pAVar12->vAttrs->pArray[7];
            pvVar6 = *(void **)(piVar4 + 2);
            if (pvVar6 == (void *)0x0) goto LAB_002a162b;
            iVar5 = pObj->Id;
            lVar17 = (long)iVar5;
            iVar1 = *piVar4;
            if (iVar1 <= iVar5) {
              iVar15 = iVar5 + 10;
              if (iVar5 < iVar1 * 2) {
                iVar15 = iVar1 * 2;
              }
              if (iVar1 < iVar15) {
                pvVar6 = realloc(pvVar6,(long)iVar15 * 8);
                *(void **)(piVar4 + 2) = pvVar6;
                memset((void *)((long)pvVar6 + (long)*piVar4 * 8),0,
                       ((long)iVar15 - (long)*piVar4) * 8);
                *piVar4 = iVar15;
              }
            }
            pDVar8 = *(DdNode **)((long)pvVar6 + lVar17 * 8);
            if (pDVar8 == (DdNode *)0x0) {
              if (*(code **)(piVar4 + 8) == (code *)0x0) {
                pDVar8 = (DdNode *)0x0;
              }
              else {
                uVar7 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
                *(undefined8 *)(*(long *)(piVar4 + 2) + lVar17 * 8) = uVar7;
                pDVar8 = *(DdNode **)(*(long *)(piVar4 + 2) + lVar17 * 8);
              }
            }
            pAVar13 = Abc_NodeFromGlobalBdds(pAVar11,ddDestination,pDVar8,fReverse);
            Abc_ObjAddFanin((pObj->field_6).pCopy,pAVar13);
          }
          lVar16 = lVar16 + 1;
          pVVar9 = pNtk->vCos;
        } while (lVar16 < pVVar9->nSize);
      }
      Extra_ProgressBarStop(p);
      return pAVar11;
    }
    if (pAVar11->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk->pExdc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                    ,0x93,"Abc_Ntk_t *Abc_NtkFromGlobalBdds(Abc_Ntk_t *, int)");
    }
    if (pAVar11->vCos->nSize != 1) {
      __assert_fail("Abc_NtkCoNum(pNtk->pExdc) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                    ,0x94,"Abc_Ntk_t *Abc_NtkFromGlobalBdds(Abc_Ntk_t *, int)");
    }
    pvVar6 = Abc_NtkBuildGlobalBdds(pAVar11,10000000,1,1,0,0);
    if (pvVar6 == (void *)0x0) {
      return (Abc_Ntk_t *)0x0;
    }
    pVVar9 = pNtk->pExdc->vAttrs;
    if ((7 < pVVar9->nSize) && (pVVar2 = pNtk->pExdc->vCos, 0 < pVVar2->nSize)) {
      plVar3 = (long *)*pVVar2->pArray;
      lVar16 = *(long *)(*plVar3 + 0x1b0);
      if (7 < *(int *)(lVar16 + 4)) {
        piVar4 = *(int **)(*(long *)(lVar16 + 8) + 0x38);
        pvVar6 = *(void **)(piVar4 + 2);
        if (pvVar6 == (void *)0x0) {
LAB_002a162b:
          __assert_fail("p->pArrayPtr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                        ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
        }
        ddSource = *(DdManager **)((long)pVVar9->pArray[7] + 0x10);
        iVar5 = (int)plVar3[2];
        lVar16 = (long)iVar5;
        iVar1 = *piVar4;
        if (iVar1 <= iVar5) {
          iVar15 = iVar5 + 10;
          if (iVar5 < iVar1 * 2) {
            iVar15 = iVar1 * 2;
          }
          if (iVar1 < iVar15) {
            pvVar6 = realloc(pvVar6,(long)iVar15 * 8);
            *(void **)(piVar4 + 2) = pvVar6;
            memset((void *)((long)pvVar6 + (long)*piVar4 * 8),0,((long)iVar15 - (long)*piVar4) * 8);
            *piVar4 = iVar15;
          }
        }
        pDVar8 = *(DdNode **)((long)pvVar6 + lVar16 * 8);
        if (pDVar8 == (DdNode *)0x0) {
          if (*(code **)(piVar4 + 8) == (code *)0x0) {
            pDVar8 = (DdNode *)0x0;
          }
          else {
            uVar7 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
            *(undefined8 *)(*(long *)(piVar4 + 2) + lVar16 * 8) = uVar7;
            pDVar8 = *(DdNode **)(*(long *)(piVar4 + 2) + lVar16 * 8);
          }
        }
        pDVar8 = Cudd_bddTransfer(ddSource,ddDestination,pDVar8);
        Cudd_Ref(pDVar8);
        Abc_NtkFreeGlobalBdds(pNtk->pExdc,1);
        pVVar9 = pNtk->vCos;
        if (0 < pVVar9->nSize) {
          lVar16 = 0;
          do {
            plVar3 = (long *)pVVar9->pArray[lVar16];
            if (*(int *)(*(long *)(*plVar3 + 0x1b0) + 4) < 8) goto LAB_002a160c;
            piVar4 = *(int **)(*(long *)(*(long *)(*plVar3 + 0x1b0) + 8) + 0x38);
            pvVar6 = *(void **)(piVar4 + 2);
            if (pvVar6 == (void *)0x0) goto LAB_002a162b;
            iVar5 = (int)plVar3[2];
            lVar17 = (long)iVar5;
            iVar1 = *piVar4;
            if (iVar1 <= iVar5) {
              iVar15 = iVar5 + 10;
              if (iVar5 < iVar1 * 2) {
                iVar15 = iVar1 * 2;
              }
              if (iVar1 < iVar15) {
                pvVar6 = realloc(pvVar6,(long)iVar15 * 8);
                *(void **)(piVar4 + 2) = pvVar6;
                memset((void *)((long)pvVar6 + (long)*piVar4 * 8),0,
                       ((long)iVar15 - (long)*piVar4) * 8);
                *piVar4 = iVar15;
              }
            }
            pDVar10 = *(DdNode **)((long)pvVar6 + lVar17 * 8);
            if (pDVar10 == (DdNode *)0x0) {
              if (*(code **)(piVar4 + 8) == (code *)0x0) {
                pDVar10 = (DdNode *)0x0;
              }
              else {
                uVar7 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
                *(undefined8 *)(*(long *)(piVar4 + 2) + lVar17 * 8) = uVar7;
                pDVar10 = *(DdNode **)(*(long *)(piVar4 + 2) + lVar17 * 8);
              }
            }
            n = Cudd_bddAnd(ddDestination,pDVar10,(DdNode *)((ulong)pDVar8 ^ 1));
            Cudd_Ref(n);
            n_00 = Cudd_bddAnd(ddDestination,(DdNode *)((ulong)pDVar10 ^ 1),
                               (DdNode *)((ulong)pDVar8 ^ 1));
            Cudd_Ref(n_00);
            Cudd_RecursiveDeref(ddDestination,pDVar10);
            pDVar10 = Cudd_bddIsop(ddDestination,n,(DdNode *)((ulong)n_00 ^ 1));
            Cudd_Ref(pDVar10);
            Cudd_RecursiveDeref(ddDestination,n);
            Cudd_RecursiveDeref(ddDestination,n_00);
            if (*(int *)(*(long *)(*plVar3 + 0x1b0) + 4) < 8) goto LAB_002a160c;
            piVar4 = *(int **)(*(long *)(*(long *)(*plVar3 + 0x1b0) + 8) + 0x38);
            pvVar6 = *(void **)(piVar4 + 2);
            if (pvVar6 == (void *)0x0) {
              __assert_fail("p->pArrayPtr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                            ,0xe5,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
            }
            if (*(long *)(piVar4 + 8) != 0) {
              __assert_fail("p->pFuncStartObj == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                            ,0xe6,"void Vec_AttWriteEntry(Vec_Att_t *, int, void *)");
            }
            iVar5 = (int)plVar3[2];
            iVar1 = *piVar4;
            if (iVar1 <= iVar5) {
              iVar15 = iVar5 + 10;
              if (iVar5 < iVar1 * 2) {
                iVar15 = iVar1 * 2;
              }
              if (iVar1 < iVar15) {
                pvVar6 = realloc(pvVar6,(long)iVar15 * 8);
                *(void **)(piVar4 + 2) = pvVar6;
                memset((void *)((long)*piVar4 * 8 + (long)pvVar6),0,
                       ((long)iVar15 - (long)*piVar4) * 8);
                *piVar4 = iVar15;
              }
            }
            *(DdNode **)((long)pvVar6 + (long)iVar5 * 8) = pDVar10;
            lVar16 = lVar16 + 1;
            pVVar9 = pNtk->vCos;
          } while (lVar16 < pVVar9->nSize);
        }
        Cudd_RecursiveDeref(ddDestination,pDVar8);
        goto LAB_002a1424;
      }
    }
  }
LAB_002a160c:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkFromGlobalBdds( Abc_Ntk_t * pNtk, int fReverse )
{
    ProgressBar * pProgress;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode, * pDriver, * pNodeNew;
    DdManager * dd = (DdManager *)Abc_NtkGlobalBddMan( pNtk );
    int i;

    // extract don't-care and compute ISOP
    if ( pNtk->pExdc )
    {
        DdManager * ddExdc = NULL;
        DdNode * bBddMin, * bBddDc, * bBddL, * bBddU;
        assert( Abc_NtkIsStrash(pNtk->pExdc) );
        assert( Abc_NtkCoNum(pNtk->pExdc) == 1 );
        // compute the global BDDs
        if ( Abc_NtkBuildGlobalBdds(pNtk->pExdc, 10000000, 1, 1, 0, 0) == NULL )
            return NULL;
        // transfer tot the same manager
        ddExdc = (DdManager *)Abc_NtkGlobalBddMan( pNtk->pExdc );
        bBddDc = (DdNode *)Abc_ObjGlobalBdd(Abc_NtkCo(pNtk->pExdc, 0));
        bBddDc = Cudd_bddTransfer( ddExdc, dd, bBddDc );  Cudd_Ref( bBddDc );
        Abc_NtkFreeGlobalBdds( pNtk->pExdc, 1 );
        // minimize the output
        Abc_NtkForEachCo( pNtk, pNode, i )
        {
            bBddMin = (DdNode *)Abc_ObjGlobalBdd(pNode);
            // derive lower and uppwer bound
            bBddL = Cudd_bddAnd( dd, bBddMin,           Cudd_Not(bBddDc) );  Cudd_Ref( bBddL );
            bBddU = Cudd_bddAnd( dd, Cudd_Not(bBddMin), Cudd_Not(bBddDc) );  Cudd_Ref( bBddU );
            Cudd_RecursiveDeref( dd, bBddMin );
            // compute new one
            bBddMin = Cudd_bddIsop( dd, bBddL, Cudd_Not(bBddU) );            Cudd_Ref( bBddMin );
            Cudd_RecursiveDeref( dd, bBddL );
            Cudd_RecursiveDeref( dd, bBddU );
            // update global BDD
            Abc_ObjSetGlobalBdd( pNode, bBddMin );
            //Extra_bddPrint( dd, bBddMin ); printf( "\n" );
        }
        Cudd_RecursiveDeref( dd, bBddDc );
    }

    // start the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_BDD );
    // make sure the new manager has the same number of inputs
    Cudd_bddIthVar( (DdManager *)pNtkNew->pManFunc, dd->size-1 );
    // process the POs
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjIsCi(pDriver) && !strcmp(Abc_ObjName(pNode), Abc_ObjName(pDriver)) )
        {
            Abc_ObjAddFanin( pNode->pCopy, pDriver->pCopy );
            continue;
        }
        pNodeNew = Abc_NodeFromGlobalBdds( pNtkNew, dd, (DdNode *)Abc_ObjGlobalBdd(pNode), fReverse );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );

    }
    Extra_ProgressBarStop( pProgress );
    return pNtkNew;
}